

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
          (ConfidentialTxInReference *this,ConfidentialTxInReference *param_1)

{
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__AbstractTxInReference_004d2e28;
  cfd::core::Txid::Txid
            (&(this->super_AbstractTxInReference).txid_,
             &(param_1->super_AbstractTxInReference).txid_);
  (this->super_AbstractTxInReference).vout_ = (param_1->super_AbstractTxInReference).vout_;
  cfd::core::Script::Script
            (&(this->super_AbstractTxInReference).unlocking_script_,
             &(param_1->super_AbstractTxInReference).unlocking_script_);
  (this->super_AbstractTxInReference).sequence_ = (param_1->super_AbstractTxInReference).sequence_;
  (this->super_AbstractTxInReference).script_witness_._vptr_ScriptWitness =
       (_func_int **)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->super_AbstractTxInReference).script_witness_.witness_stack_,
             &(param_1->super_AbstractTxInReference).script_witness_.witness_stack_);
  (this->super_AbstractTxInReference)._vptr_AbstractTxInReference =
       (_func_int **)&PTR__ConfidentialTxInReference_004e1000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->blinding_nonce_).data_,&(param_1->blinding_nonce_).data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->asset_entropy_).data_,&(param_1->asset_entropy_).data_);
  cfd::core::ConfidentialValue::ConfidentialValue
            (&this->issuance_amount_,&param_1->issuance_amount_);
  cfd::core::ConfidentialValue::ConfidentialValue(&this->inflation_keys_,&param_1->inflation_keys_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->issuance_amount_rangeproof_).data_,
             &(param_1->issuance_amount_rangeproof_).data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->inflation_keys_rangeproof_).data_,&(param_1->inflation_keys_rangeproof_).data_)
  ;
  (this->pegin_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->pegin_witness_).witness_stack_,&(param_1->pegin_witness_).witness_stack_);
  return;
}

Assistant:

class CFD_CORE_EXPORT ConfidentialTxInReference
    : public AbstractTxInReference {
 public:
  /**
   * @brief constructor.
   * @param[in] tx_in   TxIn
   */
  explicit ConfidentialTxInReference(const ConfidentialTxIn& tx_in);
  /**
   * @brief default constructor.
   */
  ConfidentialTxInReference();

  /**
   * @brief destructor
   */
  virtual ~ConfidentialTxInReference() {
    // do nothing
  }

  /**
   * @brief Get Blinding Nonce
   * @return BlindingNonce
   */
  ByteData256 GetBlindingNonce() const { return blinding_nonce_; }
  /**
   * @brief Get AssetEntropy
   * @return AssetEntropy
   */
  ByteData256 GetAssetEntropy() const { return asset_entropy_; }
  /**
   * @brief Get IssuanceAmount
   * @return IssuanceAmount
   */
  ConfidentialValue GetIssuanceAmount() const { return issuance_amount_; }
  /**
   * @brief Get InflationKeys
   * @return InflationKeys
   */
  ConfidentialValue GetInflationKeys() const { return inflation_keys_; }
  /**
   * @brief Get IssuanceAmountRangeproof
   * @return IssuanceAmountRangeproof
   */
  ByteData GetIssuanceAmountRangeproof() const {
    return issuance_amount_rangeproof_;
  }
  /**
   * @brief Get InflationKeysRangeproof
   * @return InflationKeysRangeproof
   */
  ByteData GetInflationKeysRangeproof() const {
    return inflation_keys_rangeproof_;
  }
  /**
   * @brief Get PeginWitness
   * @return ScriptWitness instance of PeginWitness
   */
  ScriptWitness GetPeginWitness() const { return pegin_witness_; }
  /**
   * @brief Get the current stack count of pegin witness.
   * @return stack count of pegin witness.
   */
  uint32_t GetPeginWitnessStackNum() const {
    return pegin_witness_.GetWitnessNum();
  }

  /**
   * @brief estimate txin's size, and witness size.
   * @param[in] addr_type           address type
   * @param[in] redeem_script       redeem script
   * @param[in] is_blind            blind transaction (for issuance/reissuance)
   * @param[in] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in] claim_script        fedpeg script
   * @param[in] scriptsig_template     scriptsig template
   * @param[out] witness_area_size     witness area size
   * @param[out] no_witness_area_size  no witness area size
   * @return TxIn size.
   */
  uint32_t EstimateTxInSize(
      AddressType addr_type, Script redeem_script = Script(),
      bool is_blind = false, int exponent = 0,
      int minimum_bits = kDefaultBlindMinimumBits,
      Script claim_script = Script(),
      const Script* scriptsig_template = nullptr,
      uint32_t* witness_area_size = nullptr,
      uint32_t* no_witness_area_size = nullptr) const;

  /**
   * @brief estimate txin's virtual size direct.
   * @param[in] addr_type           address type
   * @param[in] redeem_script       redeem script
   * @param[in] is_blind            blind transaction (for issuance/reissuance)
   * @param[in] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   * @param[in] claim_script        fedpeg script
   * @param[in] scriptsig_template  scriptsig template
   * @return TxIn virtual size.
   */
  uint32_t EstimateTxInVsize(
      AddressType addr_type, Script redeem_script = Script(),
      bool is_blind = false, int exponent = 0,
      int minimum_bits = kDefaultBlindMinimumBits,
      Script claim_script = Script(),
      const Script* scriptsig_template = nullptr) const;

 private:
  ByteData256 blinding_nonce_;           //!< nonce for blind
  ByteData256 asset_entropy_;            //!< asset entropy
  ConfidentialValue issuance_amount_;    //!< issuance_amount
  ConfidentialValue inflation_keys_;     //!< inflation key
  ByteData issuance_amount_rangeproof_;  //!< amount rangeproof
  ByteData inflation_keys_rangeproof_;   //!< inflation key rangeproof
  ScriptWitness pegin_witness_;          //!< witness stack for pegin
}